

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

void __thiscall cmFindBase::FillCMakeVariablePath(cmFindBase *this)

{
  bool bVar1;
  mapped_type *this_00;
  string var;
  cmAlphaNum local_90;
  string local_60;
  cmAlphaNum local_40;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,&cmFindCommon::PathLabel::CMake);
  local_90.View_._M_len = (size_t)&DAT_00000006;
  local_90.View_._M_str = "CMAKE_";
  local_40.View_._M_str = (this->super_cmFindCommon).CMakePathName._M_dataplus._M_p;
  local_40.View_._M_len = (this->super_cmFindCommon).CMakePathName._M_string_length;
  cmStrCat<char[6]>(&local_60,&local_90,&local_40,(char (*) [6])0x6888e9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_PREFIX_PATH",(allocator<char> *)&local_40);
  cmSearchPath::AddCMakePrefixPath(this_00,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  cmSearchPath::AddCMakePath(this_00,&local_60);
  bVar1 = std::operator==(&(this->super_cmFindCommon).CMakePathName,"PROGRAM");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"CMAKE_APPBUNDLE_PATH",(allocator<char> *)&local_40);
    cmSearchPath::AddCMakePath(this_00,(string *)&local_90);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"CMAKE_FRAMEWORK_PATH",(allocator<char> *)&local_40);
    cmSearchPath::AddCMakePath(this_00,(string *)&local_90);
  }
  std::__cxx11::string::~string((string *)&local_90);
  cmSearchPath::AddSuffixes(this_00,&(this->super_cmFindCommon).SearchPathSuffixes);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void cmFindBase::FillCMakeVariablePath()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMake];

  // Add CMake variables of the same name as the previous environment
  // variables CMAKE_*_PATH to be used most of the time with -D
  // command line options
  std::string var = cmStrCat("CMAKE_", this->CMakePathName, "_PATH");
  paths.AddCMakePrefixPath("CMAKE_PREFIX_PATH");
  paths.AddCMakePath(var);

  if (this->CMakePathName == "PROGRAM") {
    paths.AddCMakePath("CMAKE_APPBUNDLE_PATH");
  } else {
    paths.AddCMakePath("CMAKE_FRAMEWORK_PATH");
  }
  paths.AddSuffixes(this->SearchPathSuffixes);
}